

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::crate::CrateReader::ReadIntArray<int>
          (CrateReader *this,bool is_compressed,vector<int,_std::allocator<int>_> *d)

{
  void *__buf;
  pointer piVar1;
  int *out;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  ssize_t sVar5;
  int iVar6;
  char *pcVar7;
  ulong __new_size;
  uint32_t n;
  uint32_t shapesize;
  ostringstream ss_e;
  uint local_1cc;
  ulong local_1c8 [5];
  ostringstream local_1a0 [376];
  
  if ((this->_version[0] == '\0') && (this->_version[1] < 7)) {
    bVar2 = StreamReader::read4(this->_sr,(uint32_t *)local_1c8);
    if (bVar2) {
      bVar2 = StreamReader::read4(this->_sr,&local_1cc);
      if (bVar2) {
        __new_size = (ulong)local_1cc;
        goto LAB_00192e03;
      }
      ::std::__cxx11::ostringstream::ostringstream(local_1a0);
      poVar3 = ::std::operator<<((ostream *)local_1a0,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,"[Crate]");
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ReadIntArray");
      poVar3 = ::std::operator<<(poVar3,"():");
      iVar6 = 0x16b;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_1a0);
      poVar3 = ::std::operator<<((ostream *)local_1a0,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ReadIntArray");
      poVar3 = ::std::operator<<(poVar3,"():");
      iVar6 = 0x166;
    }
  }
  else {
    bVar2 = StreamReader::read8(this->_sr,local_1c8);
    __new_size = local_1c8[0];
    if (bVar2) {
LAB_00192e03:
      if (__new_size == 0) {
        piVar1 = (d->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_start;
        if ((d->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish == piVar1) {
          return true;
        }
        (d->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
             = piVar1;
        return true;
      }
      if ((this->_config).maxArrayElements < __new_size) {
        ::std::__cxx11::ostringstream::ostringstream(local_1a0);
        poVar3 = ::std::operator<<((ostream *)local_1a0,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,"[Crate]");
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"ReadIntArray");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x180);
        ::std::operator<<(poVar3," ");
        pcVar7 = "Too large array elements.";
      }
      else {
        __buf = (void *)(__new_size * 4);
        uVar4 = this->_memoryUsage + (long)__buf;
        this->_memoryUsage = uVar4;
        if ((this->_config).maxMemoryBudget < uVar4) {
          ::std::__cxx11::ostringstream::ostringstream(local_1a0);
          poVar3 = ::std::operator<<((ostream *)local_1a0,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,"[Crate]");
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReadIntArray");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x183);
          ::std::operator<<(poVar3," ");
          pcVar7 = "Reached to max memory budget.";
        }
        else {
          ::std::vector<int,_std::allocator<int>_>::resize(d,__new_size);
          if (is_compressed) {
            if (0xf < __new_size) {
              out = (d->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
              bVar2 = ReadCompressedInts<int>
                                (this,out,(long)(d->super__Vector_base<int,_std::allocator<int>_>).
                                                _M_impl.super__Vector_impl_data._M_finish -
                                          (long)out >> 2);
              return bVar2;
            }
            sVar5 = StreamReader::read(this->_sr,(int)__buf,__buf,
                                       (size_t)(d->super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_start);
            if (sVar5 != 0) {
              return true;
            }
            ::std::__cxx11::ostringstream::ostringstream(local_1a0);
            poVar3 = ::std::operator<<((ostream *)local_1a0,"[error]");
            poVar3 = ::std::operator<<(poVar3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar3 = ::std::operator<<(poVar3,"[Crate]");
            poVar3 = ::std::operator<<(poVar3,":");
            poVar3 = ::std::operator<<(poVar3,"ReadIntArray");
            poVar3 = ::std::operator<<(poVar3,"():");
            poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x197);
            ::std::operator<<(poVar3," ");
            pcVar7 = "Failed to read uncompressed integer array data.";
          }
          else {
            sVar5 = StreamReader::read(this->_sr,(int)__buf,__buf,
                                       (size_t)(d->super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_start);
            if (sVar5 != 0) {
              return true;
            }
            ::std::__cxx11::ostringstream::ostringstream(local_1a0);
            poVar3 = ::std::operator<<((ostream *)local_1a0,"[error]");
            poVar3 = ::std::operator<<(poVar3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar3 = ::std::operator<<(poVar3,"[Crate]");
            poVar3 = ::std::operator<<(poVar3,":");
            poVar3 = ::std::operator<<(poVar3,"ReadIntArray");
            poVar3 = ::std::operator<<(poVar3,"():");
            poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x18c);
            ::std::operator<<(poVar3," ");
            pcVar7 = "Failed to read integer array data.";
          }
        }
      }
      goto LAB_00193023;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar3 = ::std::operator<<((ostream *)local_1a0,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,"[Crate]");
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"ReadIntArray");
    poVar3 = ::std::operator<<(poVar3,"():");
    iVar6 = 0x171;
  }
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,iVar6);
  ::std::operator<<(poVar3," ");
  pcVar7 = "Failed to read the number of array elements.";
LAB_00193023:
  poVar3 = ::std::operator<<((ostream *)local_1a0,pcVar7);
  ::std::operator<<(poVar3,"\n");
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::append((string *)&this->_err);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return false;
}

Assistant:

bool CrateReader::ReadIntArray(bool is_compressed, std::vector<T> *d) {

  size_t length{0}; // uncompressed array elements.
  // < ver 0.7.0  use 32bit
  if (VERSION_LESS_THAN_0_8_0(_version)) {
      uint32_t shapesize; // not used
      if (!_sr->read4(&shapesize)) {
        PUSH_ERROR("Failed to read the number of array elements.");
        return false;
      }
    uint32_t n;
    if (!_sr->read4(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
    }
    length = size_t(n);
  } else {
    uint64_t n;
    if (!_sr->read8(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
      return false;
    }

    DCOUT("array.len = " << n);
    length = size_t(n);
  }

  DCOUT("array.len = " << length);
  if (length == 0) {
    d->clear();
    return true;
  }

  if (length > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too large array elements.");
  }

  CHECK_MEMORY_USAGE(sizeof(T) * length);

  d->resize(length);

  if (!is_compressed) {

    // TODO(syoyo): Zero-copy
    if (!_sr->read(sizeof(T) * length, sizeof(T) * length,
                   reinterpret_cast<uint8_t *>(d->data()))) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read integer array data.");
    }

    return true;

  } else {

    if (length < crate::kMinCompressedArraySize) {
      size_t sz = sizeof(T) * length;
      // Not stored in compressed for smaller data
      if (!_sr->read(sz, sz, reinterpret_cast<uint8_t *>(d->data()))) {
        PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read uncompressed integer array data.");
      }
      return true;
    }

    return ReadCompressedInts(d->data(), d->size());
  }
}